

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::get_ubjson_value(binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                   *this,char_int_type prefix)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 in_ESI;
  long in_RDI;
  double dVar5;
  string last_token;
  string_t s_1;
  string_t s;
  string last_token_1;
  double number_9;
  float number_8;
  double val;
  uint half;
  uchar byte2;
  uchar byte1;
  char_int_type byte2_raw;
  char_int_type byte1_raw;
  uint64_t number_7;
  uint32_t number_6;
  uint16_t number_5;
  int64_t number_4;
  int32_t number_3;
  int16_t number_2;
  int8_t number_1;
  uint8_t number;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  allocator<char> *in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  char __c;
  double *in_stack_fffffffffffffc88;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  input_format_t iVar7;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffc98;
  undefined8 uVar8;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 uVar9;
  undefined2 in_stack_fffffffffffffca4;
  undefined1 in_stack_fffffffffffffca6;
  undefined1 in_stack_fffffffffffffca7;
  char *in_stack_fffffffffffffca8;
  undefined2 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb2;
  undefined1 in_stack_fffffffffffffcb3;
  undefined4 in_stack_fffffffffffffcb4;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  string *in_stack_fffffffffffffcc8;
  string *detail;
  undefined8 in_stack_fffffffffffffcd0;
  input_format_t format;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffcd8;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *this_00;
  byte local_2ea;
  byte local_2ca;
  double local_2b8;
  byte local_2a8;
  byte local_2a7;
  byte local_2a6;
  byte local_2a5;
  byte local_2a4;
  byte local_2a3;
  byte local_2a2;
  byte local_2a1;
  allocator<char> local_289;
  string local_288 [8];
  void *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  input_format_t in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdcf;
  string_t *in_stack_fffffffffffffdd0;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffdd8;
  string local_200 [24];
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffe18;
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [39];
  undefined1 local_191 [33];
  string local_170 [32];
  string local_150 [32];
  undefined1 local_130 [40];
  string local_108 [37];
  byte local_e3;
  byte local_e2;
  allocator<char> local_e1;
  string local_e0 [32];
  undefined8 local_c0;
  byte local_b3;
  byte local_b2;
  allocator<char> local_b1;
  string local_b0 [32];
  float local_90;
  allocator<char> local_79;
  string local_78 [32];
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_ffffffffffffffa8;
  bool local_1;
  
  format = (input_format_t)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  __c = (char)((ulong)in_stack_fffffffffffffc80 >> 0x38);
  iVar7 = (input_format_t)((ulong)in_stack_fffffffffffffc90 >> 0x20);
  switch(in_ESI) {
  default:
    goto LAB_0027ddc4;
  case 0x43:
    get((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
         *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    bVar1 = unexpect_eof((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                          *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                         in_stack_fffffffffffffd94,(char *)in_stack_fffffffffffffd88);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (*(int *)(in_RDI + 0x10) < 0x80) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88,__c,
                   in_stack_fffffffffffffc78);
        std::allocator<char>::~allocator(&local_1b9);
        bVar2 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x28))
                          (*(long **)(in_RDI + 0x28),local_1b8);
        local_1 = (bool)(bVar2 & 1);
        std::__cxx11::string::~string(local_1b8);
      }
      else {
        iVar7 = (input_format_t)((ulong)local_108 >> 0x20);
        get_token_string(in_stack_fffffffffffffcb8);
        this_00 = *(binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                    **)(in_RDI + 0x28);
        uVar8 = *(undefined8 *)(in_RDI + 0x18);
        concat<std::__cxx11::string,char_const(&)[58],std::__cxx11::string&>
                  ((char (*) [58])in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
        detail = (string *)local_191;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcb4,
                            CONCAT13(in_stack_fffffffffffffcb3,
                                     CONCAT12(in_stack_fffffffffffffcb2,in_stack_fffffffffffffcb0)))
                   ,in_stack_fffffffffffffca8,
                   (allocator<char> *)
                   CONCAT17(in_stack_fffffffffffffca7,
                            CONCAT16(in_stack_fffffffffffffca6,
                                     CONCAT24(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0)))
                  );
        exception_message(this_00,iVar7,detail,
                          (string *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
        parse_error::create<std::nullptr_t,_0>
                  (in_stack_fffffffffffffd9c,
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        bVar2 = (**(code **)((this_00->ia).current._M_current + 0x60))
                          (this_00,uVar8,local_108,local_130);
        local_1 = (bool)(bVar2 & 1);
        parse_error::~parse_error((parse_error *)0x27daf8);
        std::__cxx11::string::~string(local_150);
        std::__cxx11::string::~string((string *)(local_191 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_191);
        std::__cxx11::string::~string(local_170);
        std::__cxx11::string::~string(local_108);
      }
    }
    else {
      local_1 = false;
    }
    break;
  case 0x44:
    local_c0 = 0;
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<double,false>(in_stack_fffffffffffffc98,iVar7,in_stack_fffffffffffffc88);
    uVar8 = local_c0;
    local_e2 = 0;
    local_e3 = 0;
    local_2ea = 0;
    if (bVar1) {
      plVar6 = *(long **)(in_RDI + 0x28);
      std::allocator<char>::allocator();
      local_e2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcb4,
                          CONCAT13(in_stack_fffffffffffffcb3,
                                   CONCAT12(in_stack_fffffffffffffcb2,in_stack_fffffffffffffcb0))),
                 in_stack_fffffffffffffca8,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffffca7,
                          CONCAT16(in_stack_fffffffffffffca6,
                                   CONCAT24(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0))));
      local_e3 = 1;
      local_2ea = (**(code **)(*plVar6 + 0x20))(uVar8,plVar6,local_e0);
    }
    local_1 = (bool)(local_2ea & 1);
    if ((local_e3 & 1) != 0) {
      std::__cxx11::string::~string(local_e0);
    }
    if ((local_e2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_e1);
    }
    break;
  case 0x46:
    bVar2 = (**(code **)(**(long **)(in_RDI + 0x28) + 8))(*(long **)(in_RDI + 0x28),0);
    local_1 = (bool)(bVar2 & 1);
    break;
  case 0x48:
    local_1 = get_ubjson_high_precision_number(in_stack_ffffffffffffffa8);
    break;
  case 0x49:
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<short,false>
                      (in_stack_fffffffffffffc98,iVar7,(short *)in_stack_fffffffffffffc88);
    local_2a3 = 0;
    if (bVar1) {
      local_2a3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))(*(long **)(in_RDI + 0x28),0);
    }
    local_1 = (bool)(local_2a3 & 1);
    break;
  case 0x4c:
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<long,false>
                      (in_stack_fffffffffffffc98,iVar7,(long *)in_stack_fffffffffffffc88);
    local_2a5 = 0;
    if (bVar1) {
      local_2a5 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))(*(long **)(in_RDI + 0x28),0);
    }
    local_1 = (bool)(local_2a5 & 1);
    break;
  case 0x4d:
    if (*(int *)(in_RDI + 0x24) == 5) {
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_long,false>
                        (in_stack_fffffffffffffc98,iVar7,(unsigned_long *)in_stack_fffffffffffffc88)
      ;
      local_2a8 = 0;
      if (bVar1) {
        local_2a8 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))(*(long **)(in_RDI + 0x28),0);
      }
      return (bool)(local_2a8 & 1);
    }
    goto LAB_0027ddc4;
  case 0x53:
    std::__cxx11::string::string(local_1e0);
    bVar1 = get_ubjson_string(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                              (bool)in_stack_fffffffffffffdcf);
    bVar2 = 0;
    if (bVar1) {
      bVar2 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x28))(*(long **)(in_RDI + 0x28),local_1e0);
    }
    local_1 = (bool)(bVar2 & 1);
    std::__cxx11::string::~string(local_1e0);
    break;
  case 0x54:
    bVar2 = (**(code **)(**(long **)(in_RDI + 0x28) + 8))(*(long **)(in_RDI + 0x28),1);
    local_1 = (bool)(bVar2 & 1);
    break;
  case 0x55:
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_char,false>
                      (in_stack_fffffffffffffc98,iVar7,(uchar *)in_stack_fffffffffffffc88);
    local_2a1 = 0;
    if (bVar1) {
      local_2a1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))(*(long **)(in_RDI + 0x28),0);
    }
    local_1 = (bool)(local_2a1 & 1);
    break;
  case 0x5a:
    bVar2 = (**(code **)**(undefined8 **)(in_RDI + 0x28))();
    local_1 = (bool)(bVar2 & 1);
    break;
  case 0x5b:
    local_1 = get_ubjson_array(in_stack_fffffffffffffe18);
    break;
  case 100:
    local_90 = 0.0;
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<float,false>
                      (in_stack_fffffffffffffc98,iVar7,(float *)in_stack_fffffffffffffc88);
    local_b2 = 0;
    local_b3 = 0;
    local_2ca = 0;
    if (bVar1) {
      plVar6 = *(long **)(in_RDI + 0x28);
      dVar5 = (double)local_90;
      std::allocator<char>::allocator();
      local_b2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcb4,
                          CONCAT13(in_stack_fffffffffffffcb3,
                                   CONCAT12(in_stack_fffffffffffffcb2,in_stack_fffffffffffffcb0))),
                 in_stack_fffffffffffffca8,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffffca7,
                          CONCAT16(in_stack_fffffffffffffca6,
                                   CONCAT24(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0))));
      local_b3 = 1;
      local_2ca = (**(code **)(*plVar6 + 0x20))(dVar5,plVar6,local_b0);
    }
    local_1 = (bool)(local_2ca & 1);
    if ((local_b3 & 1) != 0) {
      std::__cxx11::string::~string(local_b0);
    }
    if ((local_b2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_b1);
    }
    break;
  case 0x68:
    if (*(int *)(in_RDI + 0x24) == 5) {
      uVar3 = get((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                   *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
      bVar1 = unexpect_eof((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                            *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                           in_stack_fffffffffffffd94,(char *)in_stack_fffffffffffffd88);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
      uVar4 = get((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                   *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
      bVar1 = unexpect_eof((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                            *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                           in_stack_fffffffffffffd94,(char *)in_stack_fffffffffffffd88);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_2b8 = get_ubjson_value::anon_class_8_1_898c6d31::operator()
                              ((anon_class_8_1_898c6d31 *)in_stack_fffffffffffffc98);
        plVar6 = *(long **)(in_RDI + 0x28);
        if (((uVar4 & 0xff) * 0x100 + (uVar3 & 0xff) & 0x8000) != 0) {
          local_2b8 = -local_2b8;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcb4,
                            CONCAT13(in_stack_fffffffffffffcb3,
                                     CONCAT12(in_stack_fffffffffffffcb2,in_stack_fffffffffffffcb0)))
                   ,in_stack_fffffffffffffca8,
                   (allocator<char> *)
                   CONCAT17(in_stack_fffffffffffffca7,
                            CONCAT16(in_stack_fffffffffffffca6,
                                     CONCAT24(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0)))
                  );
        bVar2 = (**(code **)(*plVar6 + 0x20))(local_2b8,plVar6,local_78);
        std::__cxx11::string::~string(local_78);
        std::allocator<char>::~allocator(&local_79);
        return (bool)(bVar2 & 1);
      }
      return false;
    }
    goto LAB_0027ddc4;
  case 0x69:
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<signed_char,false>
                      (in_stack_fffffffffffffc98,iVar7,(char *)in_stack_fffffffffffffc88);
    local_2a2 = 0;
    if (bVar1) {
      local_2a2 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))(*(long **)(in_RDI + 0x28),0);
    }
    local_1 = (bool)(local_2a2 & 1);
    break;
  case 0x6c:
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<int,false>
                      (in_stack_fffffffffffffc98,iVar7,(int *)in_stack_fffffffffffffc88);
    local_2a4 = 0;
    if (bVar1) {
      local_2a4 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))(*(long **)(in_RDI + 0x28),0);
    }
    local_1 = (bool)(local_2a4 & 1);
    break;
  case 0x6d:
    if (*(int *)(in_RDI + 0x24) == 5) {
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_int,false>
                        (in_stack_fffffffffffffc98,iVar7,(uint *)in_stack_fffffffffffffc88);
      local_2a7 = 0;
      if (bVar1) {
        local_2a7 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))(*(long **)(in_RDI + 0x28),0);
      }
      return (bool)(local_2a7 & 1);
    }
    goto LAB_0027ddc4;
  case 0x75:
    if (*(int *)(in_RDI + 0x24) == 5) {
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_short,false>
                        (in_stack_fffffffffffffc98,iVar7,(unsigned_short *)in_stack_fffffffffffffc88
                        );
      local_2a6 = 0;
      if (bVar1) {
        local_2a6 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))(*(long **)(in_RDI + 0x28),0);
      }
      return (bool)(local_2a6 & 1);
    }
LAB_0027ddc4:
    get_token_string(in_stack_fffffffffffffcb8);
    plVar6 = *(long **)(in_RDI + 0x28);
    uVar8 = *(undefined8 *)(in_RDI + 0x18);
    uVar9 = *(undefined4 *)(in_RDI + 0x24);
    std::operator+((char *)in_stack_fffffffffffffcb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcb4,
                            CONCAT13(in_stack_fffffffffffffcb3,
                                     CONCAT12(in_stack_fffffffffffffcb2,in_stack_fffffffffffffcb0)))
                  );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffcb4,
                        CONCAT13(in_stack_fffffffffffffcb3,
                                 CONCAT12(in_stack_fffffffffffffcb2,in_stack_fffffffffffffcb0))),
               in_stack_fffffffffffffca8,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffca7,
                        CONCAT16(in_stack_fffffffffffffca6,CONCAT24(in_stack_fffffffffffffca4,uVar9)
                                )));
    exception_message(in_stack_fffffffffffffcd8,format,in_stack_fffffffffffffcc8,
                      (string *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
    parse_error::create<std::nullptr_t,_0>
              (in_stack_fffffffffffffd9c,
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    bVar2 = (**(code **)(*plVar6 + 0x60))(plVar6,uVar8,local_200,&stack0xfffffffffffffdd8);
    local_1 = (bool)(bVar2 & 1);
    parse_error::~parse_error((parse_error *)0x27dee0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator(&local_289);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd98);
    std::__cxx11::string::~string(local_200);
    break;
  case 0x7b:
    local_1 = get_ubjson_object(in_stack_fffffffffffffdb8);
    break;
  case 0xffffffff:
    local_1 = unexpect_eof((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                            *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                           in_stack_fffffffffffffd94,(char *)in_stack_fffffffffffffd88);
  }
  return local_1;
}

Assistant:

bool get_ubjson_value(const char_int_type prefix)
    {
        switch (prefix)
        {
            case char_traits<char_type>::eof():  // EOF
                return unexpect_eof(input_format, "value");

            case 'T':  // true
                return sax->boolean(true);
            case 'F':  // false
                return sax->boolean(false);

            case 'Z':  // null
                return sax->null();

            case 'U':
            {
                std::uint8_t number{};
                return get_number(input_format, number) && sax->number_unsigned(number);
            }

            case 'i':
            {
                std::int8_t number{};
                return get_number(input_format, number) && sax->number_integer(number);
            }

            case 'I':
            {
                std::int16_t number{};
                return get_number(input_format, number) && sax->number_integer(number);
            }

            case 'l':
            {
                std::int32_t number{};
                return get_number(input_format, number) && sax->number_integer(number);
            }

            case 'L':
            {
                std::int64_t number{};
                return get_number(input_format, number) && sax->number_integer(number);
            }

            case 'u':
            {
                if (input_format != input_format_t::bjdata)
                {
                    break;
                }
                std::uint16_t number{};
                return get_number(input_format, number) && sax->number_unsigned(number);
            }

            case 'm':
            {
                if (input_format != input_format_t::bjdata)
                {
                    break;
                }
                std::uint32_t number{};
                return get_number(input_format, number) && sax->number_unsigned(number);
            }

            case 'M':
            {
                if (input_format != input_format_t::bjdata)
                {
                    break;
                }
                std::uint64_t number{};
                return get_number(input_format, number) && sax->number_unsigned(number);
            }

            case 'h':
            {
                if (input_format != input_format_t::bjdata)
                {
                    break;
                }
                const auto byte1_raw = get();
                if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format, "number")))
                {
                    return false;
                }
                const auto byte2_raw = get();
                if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format, "number")))
                {
                    return false;
                }

                const auto byte1 = static_cast<unsigned char>(byte1_raw);
                const auto byte2 = static_cast<unsigned char>(byte2_raw);

                // code from RFC 7049, Appendix D, Figure 3:
                // As half-precision floating-point numbers were only added
                // to IEEE 754 in 2008, today's programming platforms often
                // still only have limited support for them. It is very
                // easy to include at least decoding support for them even
                // without such support. An example of a small decoder for
                // half-precision floating-point numbers in the C language
                // is shown in Fig. 3.
                const auto half = static_cast<unsigned int>((byte2 << 8u) + byte1);
                const double val = [&half]
                {
                    const int exp = (half >> 10u) & 0x1Fu;
                    const unsigned int mant = half & 0x3FFu;
                    JSON_ASSERT(0 <= exp&& exp <= 32);
                    JSON_ASSERT(mant <= 1024);
                    switch (exp)
                    {
                        case 0:
                            return std::ldexp(mant, -24);
                        case 31:
                            return (mant == 0)
                            ? std::numeric_limits<double>::infinity()
                            : std::numeric_limits<double>::quiet_NaN();
                        default:
                            return std::ldexp(mant + 1024, exp - 25);
                    }
                }();
                return sax->number_float((half & 0x8000u) != 0
                                         ? static_cast<number_float_t>(-val)
                                         : static_cast<number_float_t>(val), "");
            }

            case 'd':
            {
                float number{};
                return get_number(input_format, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 'D':
            {
                double number{};
                return get_number(input_format, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 'H':
            {
                return get_ubjson_high_precision_number();
            }

            case 'C':  // char
            {
                get();
                if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format, "char")))
                {
                    return false;
                }
                if (JSON_HEDLEY_UNLIKELY(current > 127))
                {
                    auto last_token = get_token_string();
                    return sax->parse_error(chars_read, last_token, parse_error::create(113, chars_read,
                                            exception_message(input_format, concat("byte after 'C' must be in range 0x00..0x7F; last byte: 0x", last_token), "char"), nullptr));
                }
                string_t s(1, static_cast<typename string_t::value_type>(current));
                return sax->string(s);
            }

            case 'S':  // string
            {
                string_t s;
                return get_ubjson_string(s) && sax->string(s);
            }

            case '[':  // array
                return get_ubjson_array();

            case '{':  // object
                return get_ubjson_object();

            default: // anything else
                break;
        }
        auto last_token = get_token_string();
        return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read, exception_message(input_format, "invalid byte: 0x" + last_token, "value"), nullptr));
    }